

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O1

uint32_t MurmurHash2(void *key,int len,uint32_t seed)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = seed ^ len;
  iVar3 = len;
  if (3 < len) {
    do {
      uVar2 = uVar2 * 0x5bd1e995 ^
              ((uint)(*key * 0x5bd1e995) >> 0x18 ^ *key * 0x5bd1e995) * 0x5bd1e995;
      key = (void *)((long)key + 4);
      len = iVar3 + -4;
      bVar1 = 7 < iVar3;
      iVar3 = len;
    } while (bVar1);
  }
  if (len != 1) {
    if (len != 2) {
      if (len != 3) goto LAB_0016678c;
      uVar2 = uVar2 ^ (uint)*(byte *)((long)key + 2) << 0x10;
    }
    uVar2 = uVar2 ^ (uint)*(byte *)((long)key + 1) << 8;
  }
  uVar2 = (*key ^ uVar2) * 0x5bd1e995;
LAB_0016678c:
  uVar2 = (uVar2 >> 0xd ^ uVar2) * 0x5bd1e995;
  return uVar2 >> 0xf ^ uVar2;
}

Assistant:

uint32_t MurmurHash2 ( const void * key, int len, uint32_t seed )
{
  // 'm' and 'r' are mixing constants generated offline.
  // They're not really 'magic', they just happen to work well.

  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  // Initialize the hash to a 'random' value

  uint32_t h = seed ^ len;

  // Mix 4 bytes at a time into the hash

  const unsigned char * data = (const unsigned char *)key;

  while(len >= 4)
  {
    uint32_t k = *(uint32_t*)data;

    k *= m;
    k ^= k >> r;
    k *= m;

    h *= m;
    h ^= k;

    data += 4;
    len -= 4;
  }

  // Handle the last few bytes of the input array

  switch(len)
  {
  case 3: h ^= data[2] << 16;
  case 2: h ^= data[1] << 8;
  case 1: h ^= data[0];
      h *= m;
  };

  // Do a few final mixes of the hash to ensure the last few
  // bytes are well-incorporated.

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;

  return h;
}